

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QRect __thiscall
QFusionStyle::subElementRect(QFusionStyle *this,SubElement sr,QStyleOption *opt,QWidget *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QStyleOptionDockWidget *pQVar3;
  long lVar4;
  ulong uVar5;
  QRect *pQVar6;
  QRect QVar7;
  Representation local_30;
  Representation RStack_2c;
  
  QVar7 = QCommonStyle::subElementRect(&this->super_QCommonStyle,sr,opt,w);
  uVar5 = QVar7._8_8_;
  local_30.m_i = (int)QVar7._0_8_;
  RStack_2c.m_i = SUB84(QVar7._0_8_,4);
  if (sr - SE_ProgressBarGroove < 3) {
    uVar5._0_4_ = (opt->rect).x2;
    uVar5._4_4_ = (opt->rect).y2;
    pQVar6 = &opt->rect;
    goto LAB_00398ef5;
  }
  pQVar6 = (QRect *)&local_30;
  if (sr == SE_PushButtonFocusRect) {
    RStack_2c.m_i = QVar7.y1.m_i.m_i + 1;
    local_30.m_i = QVar7.x1.m_i.m_i;
    lVar4 = -0x100000000;
  }
  else {
    if (sr != SE_DockWidgetTitleBarText) goto LAB_00398ef5;
    pQVar3 = qstyleoption_cast<QStyleOptionDockWidget_const*>(opt);
    if (pQVar3 == (QStyleOptionDockWidget *)0x0) goto LAB_00398ef5;
    if (pQVar3->verticalTitleBar != true) {
      if (opt->direction == LeftToRight) {
        local_30.m_i = QVar7.x1.m_i.m_i + 4;
      }
      else {
        uVar5 = uVar5 & 0xffffffff00000000 | (ulong)(QVar7.x2.m_i.m_i - 4);
      }
      goto LAB_00398ef5;
    }
    lVar4 = -0x400000000;
  }
  uVar5 = uVar5 + lVar4;
LAB_00398ef5:
  uVar1 = pQVar6->x1;
  uVar2 = pQVar6->y1;
  QVar7.y1.m_i = uVar2;
  QVar7.x1.m_i = uVar1;
  QVar7.x2.m_i = (int)uVar5;
  QVar7.y2.m_i = (int)(uVar5 >> 0x20);
  return QVar7;
}

Assistant:

QRect QFusionStyle::subElementRect(SubElement sr, const QStyleOption *opt, const QWidget *w) const
{
    QRect r = QCommonStyle::subElementRect(sr, opt, w);
    switch (sr) {
    case SE_ProgressBarLabel:
    case SE_ProgressBarContents:
    case SE_ProgressBarGroove:
        return opt->rect;
    case SE_PushButtonFocusRect:
        r.adjust(0, 1, 0, -1);
        break;
    case SE_DockWidgetTitleBarText: {
        if (const QStyleOptionDockWidget *titlebar = qstyleoption_cast<const QStyleOptionDockWidget*>(opt)) {
            bool verticalTitleBar = titlebar->verticalTitleBar;
            if (verticalTitleBar) {
                r.adjust(0, 0, 0, -4);
            } else {
                if (opt->direction == Qt::LeftToRight)
                    r.adjust(4, 0, 0, 0);
                else
                    r.adjust(0, 0, -4, 0);
            }
        }

        break;
    }
    default:
        break;
    }
    return r;
}